

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

void Ref_ObjPrint(Aig_Obj_t *pObj)

{
  if (pObj != (Aig_Obj_t *)0x0) {
    printf("%d",(ulong)*(uint *)(((ulong)pObj & 0xfffffffffffffffe) + 0x24));
    printf("(%d) ",(ulong)((uint)pObj & 1));
    return;
  }
  printf("%d",0xffffffffffffffff);
  return;
}

Assistant:

void Ref_ObjPrint( Aig_Obj_t * pObj )
{
    printf( "%d", pObj? Aig_Regular(pObj)->Id : -1 );
    if ( pObj )
        printf( "(%d) ", Aig_IsComplement(pObj) );
}